

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,(unsigned_char)1>(Thread *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Simd<unsigned_int,_(unsigned_char)__x04_> SVar3;
  
  SVar3 = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  auVar1._0_4_ = -(uint)(SVar3.v[0] == 0);
  auVar1._4_4_ = -(uint)(SVar3.v[1] == 0);
  auVar1._8_4_ = -(uint)(SVar3.v[1] == 0);
  auVar1._12_4_ = 0xffffffff;
  auVar2._0_4_ = -(uint)(SVar3.v[2] == 0);
  auVar2._4_4_ = -(uint)(SVar3.v[3] == 0);
  auVar2._8_4_ = -(uint)(SVar3.v[3] == 0);
  auVar2._12_4_ = 0xffffffff;
  Push<bool>(this,SUB168(~auVar2 & _DAT_001d8750,8) + SUB168(~auVar1 & _DAT_001d8750,8) +
                  SUB168(~auVar2 & _DAT_001d8750,0) + SUB168(~auVar1 & _DAT_001d8750,0) != 0);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}